

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall GraphPropagator::fullExpl(GraphPropagator *this,vec<Lit> *ps)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BoolView *in_RSI;
  int i_1;
  int i;
  BoolView *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  BoolView *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  int local_1c;
  int local_14;
  
  local_14 = 0;
  while (iVar4 = local_14, iVar2 = nbNodes((GraphPropagator *)0x2a8452), iVar4 < iVar2) {
    getNodeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar1 = BoolView::isFixed((BoolView *)0x2a8472);
    if (bVar1) {
      in_stack_ffffffffffffffc8 = in_RSI;
      getNodeVar((GraphPropagator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      BoolView::getValLit(in_stack_ffffffffffffffb8);
      vec<Lit>::push((vec<Lit> *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                     (Lit *)in_stack_ffffffffffffffc8);
    }
    local_14 = local_14 + 1;
  }
  local_1c = 0;
  while (iVar2 = local_1c, iVar3 = nbEdges((GraphPropagator *)0x2a84d4), iVar2 < iVar3) {
    getEdgeVar((GraphPropagator *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar1 = BoolView::isFixed((BoolView *)0x2a84f4);
    if (bVar1) {
      in_stack_ffffffffffffffb8 = in_RSI;
      getEdgeVar((GraphPropagator *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_RSI >> 0x20));
      BoolView::getValLit(in_stack_ffffffffffffffb8);
      vec<Lit>::push((vec<Lit> *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                     (Lit *)in_stack_ffffffffffffffc8);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(vec<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push(getEdgeVar(i).getValLit());
		}
	}
}